

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O2

Qiniu_Error
Qiniu_CDN_GetLogList
          (Qiniu_Client *self,Qiniu_CDN_LogListRet *ret,char **domains,int domainsCount,char *day)

{
  char *url;
  char *string;
  cJSON *object;
  cJSON *pcVar1;
  char *__s;
  size_t bodyLen;
  Qiniu_Error QVar2;
  Qiniu_Json *jsonRet;
  Qiniu_Json *local_38;
  
  url = Qiniu_String_Concat2(QINIU_FUSION_HOST,"/v2/tune/log/list");
  string = Qiniu_String_Join(";",domains,domainsCount);
  object = cJSON_CreateObject();
  pcVar1 = cJSON_CreateString(day);
  cJSON_AddItemToObject(object,"day",pcVar1);
  pcVar1 = cJSON_CreateString(string);
  cJSON_AddItemToObject(object,"domains",pcVar1);
  __s = cJSON_PrintUnformatted(object);
  local_38 = (Qiniu_Json *)0x0;
  bodyLen = strlen(__s);
  QVar2 = Qiniu_Client_CallWithBuffer2(self,&local_38,url,__s,bodyLen,"application/json");
  if (QVar2.code == 200) {
    QVar2 = Qiniu_Parse_CDNLogListRet(local_38,ret,domains,domainsCount);
  }
  Qiniu_Free(url);
  Qiniu_Free(string);
  Qiniu_Free(__s);
  cJSON_Delete(object);
  QVar2._4_4_ = 0;
  return QVar2;
}

Assistant:

extern Qiniu_Error Qiniu_CDN_GetLogList(Qiniu_Client *self, Qiniu_CDN_LogListRet *ret,
                                        char *domains[], const int domainsCount, const char *day) {
    Qiniu_Error err;

    char *path = "/v2/tune/log/list";
    char *url = Qiniu_String_Concat2(QINIU_FUSION_HOST, path);

    char *domainsStr = Qiniu_String_Join(";", domains, domainsCount);

    Qiniu_Json *root = cJSON_CreateObject();
    cJSON_AddStringToObject(root, "day", day);
    cJSON_AddStringToObject(root, "domains", domainsStr);
    char *body = cJSON_PrintUnformatted(root);

    Qiniu_Json *jsonRet = NULL;

    err = Qiniu_Client_CallWithBuffer2(
            self, &jsonRet, url, body, strlen(body), "application/json");


    if (err.code == 200) {
        err = Qiniu_Parse_CDNLogListRet(jsonRet, ret, domains, domainsCount);
    }

    Qiniu_Free(url);
    Qiniu_Free(domainsStr);
    Qiniu_Free(body);
    cJSON_Delete(root);

    return err;
}